

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_msg(uint hash_id,void *message,size_t length,uchar *result)

{
  rhash ctx_00;
  rhash ctx;
  uchar *result_local;
  size_t length_local;
  void *message_local;
  uint hash_id_local;
  
  ctx_00 = rhash_init(hash_id & 0x3ff);
  if (ctx_00 == (rhash)0x0) {
    message_local._4_4_ = -1;
  }
  else {
    rhash_update(ctx_00,message,length);
    rhash_final(ctx_00,result);
    rhash_free(ctx_00);
    message_local._4_4_ = 0;
  }
  return message_local._4_4_;
}

Assistant:

RHASH_API int rhash_msg(unsigned hash_id, const void* message, size_t length, unsigned char* result)
{
	rhash ctx;
	hash_id &= RHASH_ALL_HASHES;
	ctx = rhash_init(hash_id);
	if (ctx == NULL) return -1;
	rhash_update(ctx, message, length);
	rhash_final(ctx, result);
	rhash_free(ctx);
	return 0;
}